

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_startImageSet(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  int numAttribs;
  qpXmlAttribute attribs [4];
  
  deMutex_lock(log->lock);
  attribs[0].name = "Name";
  attribs[0].type = QP_XML_ATTRIBUTE_STRING;
  attribs[0].intValue = -0x2a6;
  attribs[0].boolValue = -1;
  numAttribs = 1;
  if (description != (char *)0x0) {
    attribs[1].name = "Description";
    attribs[1].type = QP_XML_ATTRIBUTE_STRING;
    attribs[1].intValue = -0x2a6;
    attribs[1].boolValue = -1;
    numAttribs = 2;
    attribs[1].stringValue = description;
  }
  attribs[0].stringValue = name;
  dVar1 = qpXmlWriter_startElement(log->writer,"ImageSet",numAttribs,attribs);
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_startImageSet(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_startImageSet (qpTestLog* log, const char* name, const char* description)
{
	qpXmlAttribute	attribs[4];
	int				numAttribs = 0;

	DE_ASSERT(log && name);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)
		attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* <ImageSet Name="<name>"> */
	if (!qpXmlWriter_startElement(log->writer, "ImageSet", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startImageSet(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_IMAGESET));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}